

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_xmi_midiout.cpp
# Opt level: O3

void __thiscall XMISong::DoRestart(XMISong *this)

{
  TrackInfo *pTVar1;
  ulong uVar2;
  uint uVar3;
  EventSource EVar4;
  ulong uVar5;
  uint uVar6;
  
  pTVar1 = this->CurrSong;
  pTVar1->EventP = 0;
  pTVar1->Finished = false;
  uVar6 = 0;
  pTVar1->PlayedTime = 0;
  pTVar1->ForDepth = 0;
  if ((this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Count != 0) {
    (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Count = 0;
  }
  ProcessInitialMetaEvents(this);
  pTVar1 = this->CurrSong;
  if (pTVar1->EventP < pTVar1->EventLen) {
    uVar6 = 0;
    uVar2 = pTVar1->EventP;
    do {
      uVar5 = uVar2 + 1;
      if ((char)pTVar1->EventChunk[uVar2] < '\0') break;
      uVar6 = uVar6 + (int)(char)pTVar1->EventChunk[uVar2];
      pTVar1->EventP = uVar5;
      uVar2 = uVar5;
    } while (uVar5 != pTVar1->EventLen);
  }
  pTVar1->Delay = uVar6;
  uVar3 = (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Count;
  if (pTVar1->Finished == true) {
    uVar6 = 0xffffffff;
    if (uVar3 == 0) {
      EVar4 = EVENT_None;
      goto LAB_0033d137;
    }
LAB_0033d11d:
    uVar3 = ((this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Array)->Delay;
  }
  else {
    if (uVar3 != 0) goto LAB_0033d11d;
    uVar3 = 0xffffffff;
  }
  EVar4 = EVENT_Fake - (uVar6 < uVar3);
LAB_0033d137:
  this->EventDue = EVar4;
  return;
}

Assistant:

void XMISong::DoRestart()
{
	CurrSong->EventP = 0;
	CurrSong->Finished = false;
	CurrSong->PlayedTime = 0;
	CurrSong->ForDepth = 0;
	NoteOffs.Clear();

	ProcessInitialMetaEvents ();

	CurrSong->Delay = CurrSong->ReadDelay();
	EventDue = FindNextDue();
}